

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9_value_is_numeric(jx9_value *pVal)

{
  sxu32 nLen;
  uint uVar1;
  sxi32 sVar2;
  uint uVar3;
  
  if ((pVal->iFlags & 0xeU) != 0) {
    return 1;
  }
  uVar3 = pVal->iFlags & 0x161;
  uVar1 = 0;
  if ((uVar3 == 1) && (nLen = (pVal->sBlob).nByte, nLen != 0)) {
    sVar2 = SyStrIsNumeric((char *)(pVal->sBlob).pBlob,nLen,(sxu8 *)0x0,(char **)(ulong)uVar3);
    uVar1 = (uint)(sVar2 == 0);
  }
  return uVar1;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjIsNumeric(jx9_value *pObj)
{
	if( pObj->iFlags & ( MEMOBJ_BOOL|MEMOBJ_INT|MEMOBJ_REAL) ){
		return TRUE;
	}else if( pObj->iFlags & (MEMOBJ_NULL|MEMOBJ_HASHMAP|MEMOBJ_RES) ){
		return FALSE;
	}else if( pObj->iFlags & MEMOBJ_STRING ){
		SyString sStr;
		sxi32 rc;
		SyStringInitFromBuf(&sStr, SyBlobData(&pObj->sBlob), SyBlobLength(&pObj->sBlob));
		if( sStr.nByte <= 0 ){
			/* Empty string */
			return FALSE;
		}
		/* Check if the string representation looks like a numeric number */
		rc = SyStrIsNumeric(sStr.zString, sStr.nByte, 0, 0);
		return rc == SXRET_OK ? TRUE : FALSE;
	}
	/* NOT REACHED */
	return FALSE;
}